

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *g;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pIVar6 = GImGui;
  fVar10 = (window->Scroll).x;
  fVar9 = (window->Scroll).y;
  fVar8 = (window->ScrollTarget).x;
  if (fVar8 < 3.4028235e+38) {
    fVar2 = (window->ScrollTargetCenterRatio).x;
    if ((((!snap_on_edges) || (0.0 < fVar2)) || (fVar10 = 0.0, (window->WindowPadding).x < fVar8))
       && ((fVar10 = fVar8, snap_on_edges && (1.0 <= fVar2)))) {
      fVar7 = (window->ContentSize).x;
      fVar3 = (window->WindowPadding).x;
      if (fVar7 + fVar3 + (GImGui->Style).ItemSpacing.x <= fVar8) {
        fVar10 = fVar3 + fVar3 + fVar7;
      }
    }
    fVar10 = fVar10 - fVar2 * ((window->SizeFull).x - (window->ScrollbarSizes).x);
  }
  pfVar1 = &(window->ScrollTarget).y;
  if (*pfVar1 <= 3.4028235e+38 && *pfVar1 != 3.4028235e+38) {
    fVar8 = 0.0;
    if ((window->Flags & 1) == 0) {
      fVar8 = GImGui->FontBaseSize * window->FontWindowScale;
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        fVar8 = fVar8 * window->ParentWindow->FontWindowScale;
      }
      fVar9 = (GImGui->Style).FramePadding.y;
      fVar8 = fVar9 + fVar9 + fVar8;
    }
    fVar7 = ImGuiWindow::MenuBarHeight(window);
    fVar9 = (window->ScrollTarget).y;
    fVar2 = (window->ScrollTargetCenterRatio).y;
    if (((snap_on_edges) && (fVar2 <= 0.0)) && (fVar9 <= (window->WindowPadding).y)) {
      fVar9 = 0.0;
    }
    if ((snap_on_edges) && (1.0 <= fVar2)) {
      fVar3 = (window->ContentSize).y;
      fVar4 = (window->WindowPadding).y;
      if (fVar3 + fVar4 + (pIVar6->Style).ItemSpacing.y <= fVar9) {
        fVar9 = fVar4 + fVar4 + fVar3;
      }
    }
    fVar9 = fVar9 - fVar2 * (((window->SizeFull).y - (window->ScrollbarSizes).y) - (fVar8 + fVar7));
  }
  fVar10 = (float)(-(uint)(0.0 <= fVar10) & (uint)fVar10);
  fVar9 = (float)(-(uint)(0.0 <= fVar9) & (uint)fVar9);
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    fVar8 = (window->ScrollMax).x;
    if (fVar8 <= fVar10) {
      fVar10 = fVar8;
    }
    fVar8 = (window->ScrollMax).y;
    if (fVar8 <= fVar9) {
      fVar9 = fVar8;
    }
  }
  IVar5.y = fVar9;
  IVar5.x = fVar10;
  return IVar5;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        float target_x = window->ScrollTarget.x;
        if (snap_on_edges && cr_x <= 0.0f && target_x <= window->WindowPadding.x)
            target_x = 0.0f;
        else if (snap_on_edges && cr_x >= 1.0f && target_x >= window->ContentSize.x + window->WindowPadding.x + g.Style.ItemSpacing.x)
            target_x = window->ContentSize.x + window->WindowPadding.x * 2.0f;
        scroll.x = target_x - cr_x * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->ContentSize.y + window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->ContentSize.y + window->WindowPadding.y * 2.0f;
        scroll.y = target_y - cr_y * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll = ImMax(scroll, ImVec2(0.0f, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}